

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

vector<Token,_std::allocator<Token>_> *
Lexer::tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,string *code,
               vector<Token,_std::allocator<Token>_> *verbatim)

{
  vector<Token,_std::allocator<Token>_> *this;
  Token tk;
  Lexer yylex;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [40];
  Lexer local_a8;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)code);
  Lexer(&local_a8,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._0_4_ = T_EOF_SYMBOL;
  local_f8._4_4_ = 0;
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  do {
    do {
      operator()((Token *)local_d0,&local_a8);
      Token::operator=((Token *)local_f8,(Token *)local_d0);
      std::__cxx11::string::~string((string *)(local_d0 + 8));
    } while (local_f8._0_4_ == T_TEXT && verbatim == (vector<Token,_std::allocator<Token>_> *)0x0);
    this = verbatim;
    if (local_f8._0_4_ != T_TEXT) {
      this = __return_storage_ptr__;
    }
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(this,(Token *)local_f8);
  } while (local_f8._0_4_ != T_EOF_SYMBOL);
  std::__cxx11::string::~string((string *)&local_f0);
  ~Lexer(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Lexer::tokenize(std::string code,
                                   std::vector<Token>* verbatim) {
  Lexer yylex(std::move(code));
  std::vector<Token> tokens;
  Token tk;
  do {
    tk = yylex();
    if (tk.is(T_TEXT)) {
      if (verbatim) verbatim->push_back(std::move(tk));
      continue;
    }
    tokens.push_back(std::move(tk));
  } while (tk.isNot(T_EOF_SYMBOL));
  return tokens;
}